

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

void MARGINAL::undo_marginal(data *sm,example *ec)

{
  bool bVar1;
  char *pcVar2;
  int __c;
  iterator *rhs;
  long in_RDI;
  namespace_index n;
  features *in_stack_00000018;
  features *in_stack_00000020;
  iterator i;
  example_predict *in_stack_ffffffffffffffc0;
  iterator local_30;
  iterator local_20;
  long local_8;
  
  local_8 = in_RDI;
  local_20 = example_predict::begin(in_stack_ffffffffffffffc0);
  while( true ) {
    local_30 = example_predict::end(in_stack_ffffffffffffffc0);
    rhs = &local_30;
    bVar1 = example_predict::iterator::operator!=(&local_20,rhs);
    if (!bVar1) break;
    pcVar2 = example_predict::iterator::index(&local_20,(char *)rhs,__c);
    if ((*(byte *)(local_8 + 0xe + ((ulong)pcVar2 & 0xff)) & 1) != 0) {
      in_stack_ffffffffffffffc0 =
           (example_predict *)(local_8 + 0x110 + ((ulong)pcVar2 & 0xff) * 0x68);
      example_predict::iterator::operator*(&local_20);
      std::swap<features>(in_stack_00000020,in_stack_00000018);
    }
    example_predict::iterator::operator++(&local_20);
  }
  return;
}

Assistant:

void undo_marginal(data& sm, example& ec)
{
  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
      std::swap(sm.temp[n], *i);
  }
}